

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

SortOrder __thiscall QSortedModelEngine::sortOrder(QSortedModelEngine *this,QModelIndex *parent)

{
  int *piVar1;
  int iVar2;
  long *plVar3;
  SortOrder SVar4;
  long in_FS_OFFSET;
  undefined1 local_b0 [24];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 *local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar3 = (long *)QAbstractProxyModel::sourceModel();
  iVar2 = (**(code **)(*plVar3 + 0x78))(plVar3,parent);
  SVar4 = AscendingOrder;
  if (1 < iVar2) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    (**(code **)(*plVar3 + 0x60))
              (&local_98,plVar3,0,((this->super_QCompletionEngine).c)->column,parent);
    (**(code **)(*plVar3 + 0x90))
              (&local_58,plVar3,&local_98,((this->super_QCompletionEngine).c)->role);
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_58);
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaa;
    uStack_94 = 0xaaaaaaaa;
    uStack_90 = 0xaaaaaaaa;
    uStack_8c = 0xaaaaaaaa;
    (**(code **)(*plVar3 + 0x60))
              (local_b0,plVar3,iVar2 + -1,((this->super_QCompletionEngine).c)->column,parent);
    (**(code **)(*plVar3 + 0x90))
              (&local_58,plVar3,local_b0,((this->super_QCompletionEngine).c)->role);
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_58);
    iVar2 = QString::compare((QString *)&local_78,(CaseSensitivity)&local_98);
    piVar1 = (int *)CONCAT44(uStack_94,local_98);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(uStack_74,local_78);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
      }
    }
    SVar4 = (SortOrder)(0 < iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SVar4;
  }
  __stack_chk_fail();
}

Assistant:

Qt::SortOrder QSortedModelEngine::sortOrder(const QModelIndex &parent) const
{
    const QAbstractItemModel *model = c->proxy->sourceModel();

    int rowCount = model->rowCount(parent);
    if (rowCount < 2)
        return Qt::AscendingOrder;
    QString first = model->data(model->index(0, c->column, parent), c->role).toString();
    QString last = model->data(model->index(rowCount - 1, c->column, parent), c->role).toString();
    return QString::compare(first, last, c->cs) <= 0 ? Qt::AscendingOrder : Qt::DescendingOrder;
}